

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStd.cpp
# Opt level: O3

void testStringStd(int iterations)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  char *__end;
  bool bVar6;
  string blah [3];
  long *local_d8;
  size_t local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 *local_98;
  size_t sStack_90;
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  srand(100);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688","");
  plVar5 = local_48;
  local_58[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698","");
  if (0 < iterations) {
    do {
      local_d8 = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
                 "");
      iVar1 = rand();
      plVar2 = local_d8;
      if (local_d0 == (&sStack_90)[(long)(iVar1 % 3) * 4]) {
        if (local_d0 == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_d8,(&local_98)[(long)(iVar1 % 3) * 4],local_d0);
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (plVar2 != &local_c8) {
        operator_delete(plVar2,local_c8 + 1);
      }
      if (bVar6) {
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,
                   "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678"
                   ,"");
        iVar1 = rand();
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_b8,(ulong)(&local_98)[(long)(iVar1 % 3) * 4]);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_c8 = *plVar3;
          lStack_c0 = plVar2[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar3;
          local_d8 = (long *)*plVar2;
        }
        local_d0 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
      }
      iterations = iterations + -1;
    } while (iterations != 0);
  }
  lVar4 = -0x60;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  return;
}

Assistant:

void testStringStd(int iterations)
{
  srand(100);
  size_t val = 0;
  std::string blah[] = {
    "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
    "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
    "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
  };
  for (int i = 0; i < iterations; ++i)
  {
    if(std::string("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") == blah[rand() % 3])
      val += (std::string("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") + blah[rand() % 3]).length();
  }
}